

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::appendInitialize
          (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *this,qsizetype newSize)

{
  Selection *pSVar1;
  long in_RSI;
  Selection *in_RDI;
  Selection *e;
  Selection *b;
  
  begin((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)0x72c880);
  pSVar1 = begin((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)0x72c896);
  std::uninitialized_value_construct<QAbstractTextDocumentLayout::Selection*>
            (pSVar1 + in_RSI,in_RDI);
  *(long *)&(in_RDI->format).field_0x8 = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }